

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colTrie.c
# Opt level: O2

int Col_TrieMapUnset(Col_Word map,Col_Word key)

{
  byte *in_RAX;
  uint uVar1;
  int *in_RCX;
  int *piVar2;
  Col_Word parent;
  byte *local_20;
  
  if (map != 0) {
    if ((map & 0xf) == 0) {
      if ((*(byte *)map & 2) != 0) {
        uVar1 = *(byte *)map & 0xfffffffe;
        goto LAB_00113134;
      }
LAB_00113165:
      in_RCX = (int *)TrieMapFindNode(map,key,0,(int *)0x0,(Col_Word *)&local_20,&parent,
                                      (Col_Word *)0x0,(Col_Word *)0x0,(size_t *)0x0,(size_t *)0x0);
    }
    else {
      in_RAX = (byte *)(ulong)((uint)map & 0x1f);
      in_RCX = immediateWordTypes;
      uVar1 = immediateWordTypes[(long)in_RAX];
LAB_00113134:
      if (uVar1 == 0xffffffff) goto LAB_00113165;
      if (uVar1 != 0x42) goto LAB_00113197;
      in_RCX = (int *)StringTrieMapFindNode
                                (map,key,0,(int *)0x0,(Col_Word *)&local_20,&parent,(Col_Word *)0x0,
                                 (Col_Word *)0x0,(size_t *)0x0,(Col_Char *)0x0);
    }
    in_RAX = local_20;
    if (in_RCX == (int *)0x0) {
      return 0;
    }
  }
LAB_00113197:
  *(long *)(map + 0x10) = *(long *)(map + 0x10) + -1;
  if (in_RAX == (byte *)0x0) {
    *(undefined8 *)(map + 0x18) = 0;
    return 1;
  }
  piVar2 = *(int **)(parent + 0x18);
  if (in_RCX == piVar2) {
    piVar2 = *(int **)(parent + 0x10);
  }
  if (in_RAX == (byte *)map) {
    *(int **)(map + 0x18) = piVar2;
    return 1;
  }
  if (((ulong)in_RAX & 0xf) == 0) {
    if ((*in_RAX & 2) != 0) {
      uVar1 = *in_RAX & 0xfffffffe;
      goto LAB_001131e8;
    }
  }
  else {
    uVar1 = immediateWordTypes[(uint)in_RAX & 0x1f];
LAB_001131e8:
    if (uVar1 == 0x56) goto LAB_00113200;
  }
  in_RAX = (byte *)ConvertStringNodeToMutable((Col_Word)in_RAX,map,key);
LAB_00113200:
  if (*(Col_Word *)(in_RAX + 0x10) == parent) {
    *(int **)(in_RAX + 0x10) = piVar2;
  }
  else {
    *(int **)(in_RAX + 0x18) = piVar2;
  }
  return 1;
}

Assistant:

int
Col_TrieMapUnset(
    Col_Word map,   /*!< Trie map to remove entry from. */
    Col_Word key)   /*!< Entry key. Can be any word type, including string,
                         however it must match the actual type used by the
                         map. */
{
    Col_Word node, grandParent, parent, sibling;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_WORDTRIEMAP,map} */
    TYPECHECK_WORDTRIEMAP(map) return 0;

    switch (WORD_TYPE(map)) {
    case WORD_TYPE_STRTRIEMAP:
        node = StringTrieMapFindNode(map, key, 0, NULL, &grandParent, &parent,
                NULL, NULL, NULL, NULL);
        break;

    case WORD_TYPE_CUSTOM:
        node = TrieMapFindNode(map, key, 0, NULL, &grandParent, &parent, NULL,
                NULL, NULL, NULL);
        break;

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
    }

    if (!node) {
        /*
         * Not found.
         */

        return 0;
    }

    WORD_TRIEMAP_SIZE(map)--;

    if (!grandParent) {
        /*
         * Last entry.
         */

        ASSERT(parent == map);
        ASSERT(WORD_TRIEMAP_ROOT(map) == node);
        ASSERT(WORD_TRIEMAP_SIZE(map) == 0);
        WORD_TRIEMAP_ROOT(map) = WORD_NIL;

        return 1;
    }

    /*
     * Replace parent by sibling.
     */

    ASSERT(WORD_TYPE(parent) == WORD_TYPE_STRTRIENODE || WORD_TYPE(parent) == WORD_TYPE_MSTRTRIENODE);
    if (node == WORD_TRIENODE_RIGHT(parent)) {
        sibling = WORD_TRIENODE_LEFT(parent);
    } else {
        sibling = WORD_TRIENODE_RIGHT(parent);
    }
    if (grandParent == map) {
        /*
         * Parent was root.
         */

        ASSERT(WORD_TRIEMAP_ROOT(map) == parent);
        WORD_TRIEMAP_ROOT(map) = sibling;
    } else {
        if (WORD_TYPE(grandParent) != WORD_TYPE_MSTRTRIENODE) {
            /*
             * Grandparent is immutable, convert first.
             */

            ASSERT(WORD_TYPE(grandParent) == WORD_TYPE_STRTRIENODE);
            grandParent = ConvertStringNodeToMutable(grandParent, map, key);
        }
        ASSERT(WORD_TYPE(grandParent) == WORD_TYPE_MSTRTRIENODE);
        if (WORD_TRIENODE_LEFT(grandParent) == parent) {
            WORD_TRIENODE_LEFT(grandParent) = sibling;
        } else {
            WORD_TRIENODE_RIGHT(grandParent) = sibling;
        }
    }

    return 1;
}